

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cc
# Opt level: O2

ssize_t __thiscall FileWriter::write(FileWriter *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  ostream *poVar2;
  FileWriter *this_00;
  ssize_t sVar3;
  undefined4 in_register_00000034;
  string path;
  string sStack_78;
  undefined1 local_58 [40];
  void *local_30;
  undefined8 local_28;
  
  buildPath(&sStack_78,this,(string *)CONCAT44(in_register_00000034,__fd));
  bVar1 = tryWrite(this,&sStack_78);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Writing: ");
    std::operator<<(poVar2,(string *)&sStack_78);
    local_28 = 0;
    local_58._32_4_ = 0x1010000;
    local_58._0_8_ = (pointer)0x0;
    local_58._8_8_ = 0;
    local_58._16_8_ = 0;
    local_30 = __buf;
    cv::imwrite((string *)&sStack_78,(_InputArray *)(local_58 + 0x20),(vector *)local_58);
    this_00 = (FileWriter *)local_58;
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)this_00);
  }
  else {
    this_00 = (FileWriter *)std::operator<<((ostream *)&std::cout,"Skipping (file exists): ");
    std::operator<<((ostream *)this_00,(string *)&sStack_78);
  }
  logTime(this_00,(Timer *)__n);
  sVar3 = std::__cxx11::string::~string((string *)&sStack_78);
  return sVar3;
}

Assistant:

void FileWriter::write(
  const std::string& tail,
  const cv::Mat& mat,
  const Timer* t) {
  auto path = buildPath(tail);
  if (!tryWrite(path)) {
    std::cout << "Skipping (file exists): " << path;
    logTime(t);
    return;
  }

  std::cout << "Writing: " << path;
  cv::imwrite(path, mat);
  logTime(t);
}